

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O3

void __thiscall duckdb::ParquetWriter::GatherWrittenStatistics(ParquetWriter *this)

{
  idx_t iVar1;
  CopyFunctionFileStatistics *pCVar2;
  pointer pcVar3;
  pointer pPVar4;
  reference this_00;
  pointer pCVar5;
  mapped_type *pmVar6;
  pointer pCVar7;
  size_type __n;
  unique_ptr<duckdb::ParquetStatsAccumulator,_std::default_delete<duckdb::ParquetStatsAccumulator>,_true>
  *this_01;
  string min_value;
  string max_value;
  case_insensitive_map_t<Value> column_stats;
  key_type local_170;
  key_type local_150;
  optional_ptr<duckdb::CopyFunctionFileStatistics,_true> *local_130;
  unique_ptr<duckdb::ParquetStatsAccumulator,_std::default_delete<duckdb::ParquetStatsAccumulator>,_true>
  *local_128;
  string local_120;
  string local_100;
  undefined1 *local_e0;
  long local_d8;
  undefined1 local_d0 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c0;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  iVar1 = (this->file_meta_data).num_rows;
  local_130 = &this->written_stats;
  optional_ptr<duckdb::CopyFunctionFileStatistics,_true>::CheckValid(local_130);
  ((this->written_stats).ptr)->row_count = iVar1;
  this_01 = &this->stats_accumulator;
  pPVar4 = unique_ptr<duckdb::ParquetStatsAccumulator,_std::default_delete<duckdb::ParquetStatsAccumulator>,_true>
           ::operator->(this_01);
  if ((pPVar4->stats_unifiers).
      super_vector<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pPVar4->stats_unifiers).
      super_vector<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    local_128 = this_01;
    do {
      pPVar4 = unique_ptr<duckdb::ParquetStatsAccumulator,_std::default_delete<duckdb::ParquetStatsAccumulator>,_true>
               ::operator->(this_01);
      this_00 = vector<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>,_true>
                ::operator[](&pPVar4->stats_unifiers,__n);
      local_c0._M_buckets = &local_c0._M_single_bucket;
      local_c0._M_bucket_count = 1;
      local_c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_c0._M_element_count = 0;
      local_c0._M_rehash_policy._M_max_load_factor = 1.0;
      local_c0._M_rehash_policy._M_next_resize = 0;
      local_c0._M_single_bucket = (__node_base_ptr)0x0;
      pCVar5 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
               ::operator->(this_00);
      Value::UBIGINT((Value *)local_88,pCVar5->column_size_bytes);
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"column_size_bytes","")
      ;
      pmVar6 = ::std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&local_c0,&local_170);
      Value::operator=(pmVar6,(Value *)local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      Value::~Value((Value *)local_88);
      pCVar5 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
               ::operator->(this_00);
      if (pCVar5->all_min_max_set == true) {
        pCVar5 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                 ::operator->(this_00);
        pCVar7 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                 ::operator->(this_00);
        (*pCVar5->_vptr_ColumnStatsUnifier[3])(&local_170,pCVar5,&pCVar7->global_min);
        pCVar5 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                 ::operator->(this_00);
        pCVar7 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                 ::operator->(this_00);
        (*pCVar5->_vptr_ColumnStatsUnifier[3])(&local_e0,pCVar5,&pCVar7->global_max);
        pCVar5 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                 ::operator->(this_00);
        if (pCVar5->min_is_set == true) {
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_100,local_170._M_dataplus._M_p,
                     local_170._M_dataplus._M_p + local_170._M_string_length);
          Value::Value((Value *)local_88,&local_100);
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"min","");
          pmVar6 = ::std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_c0,&local_150);
          Value::operator=(pmVar6,(Value *)local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          Value::~Value((Value *)local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p);
          }
        }
        pCVar5 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                 ::operator->(this_00);
        if (pCVar5->max_is_set == true) {
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_120,local_e0,local_e0 + local_d8);
          Value::Value((Value *)local_88,&local_120);
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"max","");
          pmVar6 = ::std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_c0,&local_150);
          Value::operator=(pmVar6,(Value *)local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          Value::~Value((Value *)local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p);
          }
        }
        if (local_e0 != local_d0) {
          operator_delete(local_e0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
      }
      pCVar5 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
               ::operator->(this_00);
      if (pCVar5->all_nulls_set == true) {
        pCVar5 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                 ::operator->(this_00);
        Value::UBIGINT((Value *)local_88,pCVar5->null_count);
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"null_count","");
        pmVar6 = ::std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_c0,&local_170);
        Value::operator=(pmVar6,(Value *)local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        Value::~Value((Value *)local_88);
      }
      pCVar5 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
               ::operator->(this_00);
      if (pCVar5->can_have_nan == true) {
        pCVar5 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                 ::operator->(this_00);
        Value::BOOLEAN((Value *)local_88,pCVar5->has_nan);
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"has_nan","");
        pmVar6 = ::std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_c0,&local_170);
        Value::operator=(pmVar6,(Value *)local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        Value::~Value((Value *)local_88);
      }
      optional_ptr<duckdb::CopyFunctionFileStatistics,_true>::CheckValid(local_130);
      pCVar2 = local_130->ptr;
      pCVar5 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
               ::operator->(this_00);
      local_88[0] = local_78;
      pcVar3 = (pCVar5->column_name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,pcVar3,pcVar3 + (pCVar5->column_name)._M_string_length);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(&local_68,&local_c0);
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_emplace<std::pair<std::__cxx11::string,std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&pCVar2->column_statistics,(Value *)local_88);
      this_01 = local_128;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_68);
      if (local_88[0] != local_78) {
        operator_delete(local_88[0]);
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_c0);
      __n = __n + 1;
      pPVar4 = unique_ptr<duckdb::ParquetStatsAccumulator,_std::default_delete<duckdb::ParquetStatsAccumulator>,_true>
               ::operator->(this_01);
    } while (__n < (ulong)((long)(pPVar4->stats_unifiers).
                                 super_vector<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pPVar4->stats_unifiers).
                                 super_vector<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void ParquetWriter::GatherWrittenStatistics() {
	written_stats->row_count = file_meta_data.num_rows;

	// finalize the min/max values and write to column stats
	for (idx_t c = 0; c < stats_accumulator->stats_unifiers.size(); c++) {
		auto &stats_unifier = stats_accumulator->stats_unifiers[c];
		case_insensitive_map_t<Value> column_stats;
		column_stats["column_size_bytes"] = Value::UBIGINT(stats_unifier->column_size_bytes);
		if (stats_unifier->all_min_max_set) {
			auto min_value = stats_unifier->StatsToString(stats_unifier->global_min);
			auto max_value = stats_unifier->StatsToString(stats_unifier->global_max);
			if (stats_unifier->min_is_set) {
				column_stats["min"] = min_value;
			}
			if (stats_unifier->max_is_set) {
				column_stats["max"] = max_value;
			}
		}
		if (stats_unifier->all_nulls_set) {
			column_stats["null_count"] = Value::UBIGINT(stats_unifier->null_count);
		}
		if (stats_unifier->can_have_nan) {
			column_stats["has_nan"] = Value::BOOLEAN(stats_unifier->has_nan);
		}
		written_stats->column_statistics.insert(make_pair(stats_unifier->column_name, std::move(column_stats)));
	}
}